

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTRealTraffic.cpp
# Opt level: O2

bool __thiscall
RealTrafficConnection::ProcessTrafficBuffer(RealTrafficConnection *this,JSON_Object *pBuf)

{
  double refPressure;
  _Alloc_hider _Var1;
  bool bVar2;
  int iVar3;
  JSON_Value *pJVar4;
  JSON_Array *array;
  size_t sVar5;
  long lVar6;
  char *pcVar7;
  mapped_type *this_00;
  size_t index;
  double dVar8;
  initializer_list<unsigned_long> aIdx;
  initializer_list<unsigned_long> aIdx_00;
  initializer_list<unsigned_long> aIdx_01;
  allocator<char> local_399;
  unique_lock<std::mutex> mapFdLock;
  string s;
  positionTy local_350;
  undefined8 local_308;
  double local_300;
  double local_2f8;
  size_t local_2f0;
  FDStaticData stat;
  FDDynamicData dyn;
  string acFilter;
  FDKeyTy fdKey;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  positionTy posView;
  
  if (pBuf != (JSON_Object *)0x0) {
    DataRefs::GetDebugAcFilter_abi_cxx11_(&acFilter,&dataRefs);
    DataRefs::GetViewPos();
    local_2f0 = json_object_get_count(pBuf);
    local_308 = 0x2c3758;
    index = 0;
    while (((local_2f0 != index &&
            (iVar3 = (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                       _vptr_LTChannel[4])(this), (char)iVar3 != '\0')) &&
           (pJVar4 = json_object_get_value_at(pBuf,index), pJVar4 != (JSON_Value *)0x0))) {
      array = json_value_get_array(pJVar4);
      if (array != (JSON_Array *)0x0) {
        sVar5 = json_array_get_count(array);
        if (sVar5 < 0x30) {
          if ((int)dataRefs.iLogLevel < 3) {
            LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                   ,0x301,"ProcessTrafficBuffer",logWARN,"Received too few fields in a/c record %ld"
                   ,index);
          }
          (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel
            [8])(this);
        }
        else {
          lVar6 = jag_l(array,0x2f);
          pcVar7 = jag_s(array,0);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_98,pcVar7,(allocator<char> *)&stat);
          LTFlightData::FDKeyTy::FDKeyTy(&fdKey,(uint)(lVar6 != 0) * 2 + KEY_RT,&local_98,0x10);
          std::__cxx11::string::~string((string *)&local_98);
          if (acFilter._M_string_length == 0) {
LAB_0017d0cc:
            LTFlightData::CheckDupKey(&fdKey,(uint)(fdKey.eKeyType != KEY_ICAO) * 3 + KEY_FLARM);
            local_2f8 = json_array_get_number(array,10);
            local_2f8 = local_2f8 + this->tsAdjust;
            local_300 = json_array_get_number(array,1);
            local_350._lon = json_array_get_number(array,2);
            local_350._lat = local_300;
            local_350._alt = NAN;
            local_350._ts = local_2f8;
            local_350._head = NAN;
            local_350._pitch = NAN;
            local_350._roll = NAN;
            local_350.mergeCount = 1;
            local_350.f = (posFlagsTy)((ushort)local_350.f & 0x8000);
            local_350.edgeIdx = 0xffffffffffffffff;
            lVar6 = jag_l(array,0xe);
            if (lVar6 == 0) {
              local_350.f = (posFlagsTy)((ushort)local_350.f & 0xfcff | 0x100);
              dVar8 = jag_n_nan(array,4);
              if (NAN(dVar8)) {
                dVar8 = json_array_get_number(array,0x12);
              }
              else {
                refPressure = (this->rtWx).QNH;
                if (!NAN(refPressure)) {
                  dVar8 = BaroAltToGeoAlt_ft(dVar8,refPressure);
                }
              }
              local_350._alt = dVar8 * 0.3048;
            }
            else {
              local_350.f = (posFlagsTy)((ushort)local_350.f & 0xfcff | 0x200);
            }
            bVar2 = positionTy::isNormal(&local_350,true);
            _Var1 = fdKey.key._M_dataplus;
            if (bVar2) {
              stat.reg._M_dataplus._M_p = (pointer)&stat.reg.field_2;
              stat.reg._M_string_length = 0;
              stat.reg.field_2._M_local_buf[0] = '\0';
              stat.country._M_dataplus._M_p = (pointer)&stat.country.field_2;
              stat.country._M_string_length = 0;
              stat.country.field_2._M_local_buf[0] = '\0';
              stat.acTypeIcao._M_dataplus._M_p = (pointer)&stat.acTypeIcao.field_2;
              stat.acTypeIcao._M_string_length = 0;
              stat.acTypeIcao.field_2._M_local_buf[0] = '\0';
              stat.man._M_dataplus._M_p = (pointer)&stat.man.field_2;
              stat.man._M_string_length = 0;
              stat.man.field_2._M_local_buf[0] = '\0';
              stat.mdl._M_dataplus._M_p = (pointer)&stat.mdl.field_2;
              stat.mdl._M_string_length = 0;
              stat.mdl.field_2._M_local_buf[0] = '\0';
              stat.catDescr._M_dataplus._M_p = (pointer)&stat.catDescr.field_2;
              stat.catDescr._M_string_length = 0;
              stat.catDescr.field_2._M_local_buf[0] = '\0';
              stat.engType = -1;
              stat.engMount = -1;
              stat.year = 0;
              stat.mil = false;
              stat.pDoc8643 = (Doc8643 *)0x0;
              stat.call._M_dataplus._M_p = (pointer)&stat.call.field_2;
              stat.call._M_string_length = 0;
              stat.call.field_2._M_local_buf[0] = '\0';
              stat.stops.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              stat.stops.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              stat.stops.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              stat.flight._M_dataplus._M_p = (pointer)&stat.flight.field_2;
              stat.flight._M_string_length = 0;
              stat.flight.field_2._M_local_buf[0] = '\0';
              stat.slug._M_dataplus._M_p = (pointer)&stat.slug.field_2;
              stat.slug._M_string_length = 0;
              stat.slug.field_2._M_local_buf[0] = '\0';
              stat.op._M_dataplus._M_p = (pointer)&stat.op.field_2;
              stat.op._M_string_length = 0;
              stat.op.field_2._M_local_buf[0] = '\0';
              stat.opIcao._M_dataplus._M_p = (pointer)&stat.opIcao.field_2;
              stat.opIcao._M_string_length = 0;
              stat.opIcao.field_2._M_local_buf[0] = '\0';
              stat.bDataMaster = false;
              stat.bDataRoute = false;
              jag_s(array,8);
              std::__cxx11::string::assign((char *)&stat.acTypeIcao);
              jag_s(array,0xd);
              std::__cxx11::string::assign((char *)&stat.call);
              jag_s(array,9);
              std::__cxx11::string::assign((char *)&stat);
              pcVar7 = jag_s(array,0xb);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&dyn,pcVar7,(allocator<char> *)&mapFdLock);
              pcVar7 = jag_s(array,0xc);
              std::__cxx11::string::string<std::allocator<char>>((string *)&s,pcVar7,&local_399);
              LTFlightData::FDStaticData::setOrigDest(&stat,(string *)&dyn,&s);
              std::__cxx11::string::~string((string *)&s);
              std::__cxx11::string::~string((string *)&dyn);
              jag_s(array,0x10);
              std::__cxx11::string::assign((char *)&stat.flight);
              pcVar7 = jag_s(array,0x1c);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&s,pcVar7,(allocator<char> *)&dyn);
              GetADSBEmitterCat(&s);
              std::__cxx11::string::assign((char *)&stat.catDescr);
              bVar2 = std::operator==(&stat.acTypeIcao,"ASW20");
              if (bVar2) {
                std::__cxx11::string::assign((char *)&stat.acTypeIcao);
              }
              bVar2 = std::operator==(&s,"C3");
              if (((bVar2) || (bVar2 = std::operator==(&s,"C4"), bVar2)) ||
                 ((bVar2 = std::operator==(&s,"C5"), bVar2 ||
                  ((bVar2 = std::operator==(&stat.reg,"TWR"), bVar2 &&
                   (bVar2 = std::operator==(&stat.acTypeIcao,"TWR"), bVar2)))))) {
                std::__cxx11::string::assign((char *)&stat.acTypeIcao);
                std::__cxx11::string::_M_assign((string *)&stat);
              }
              bVar2 = std::operator==(&stat.acTypeIcao,"GRND");
              if (((((bVar2) || (bVar2 = std::operator==(&stat.acTypeIcao,"GND"), bVar2)) ||
                   (bVar2 = std::operator==(&s,"C1"), bVar2)) ||
                  (bVar2 = std::operator==(&s,"C2"), bVar2)) ||
                 (((s._M_string_length == 0 && (((ushort)local_350.f & 0x300) == 0x200)) &&
                  ((stat.acTypeIcao._M_string_length == 0 && (stat.reg._M_string_length == 0)))))) {
                std::__cxx11::string::_M_assign((string *)&stat.acTypeIcao);
              }
              LTFlightData::FDDynamicData::FDDynamicData(&dyn);
              dVar8 = jag_sn(array,6);
              dyn.radar.code = lround(dVar8);
              dyn.gnd = ((ushort)local_350.f & 0x300) == 0x200;
              mapFdLock._M_device = (mutex_type *)0x19;
              mapFdLock._M_owns = true;
              mapFdLock._9_7_ = 0;
              aIdx._M_len = 3;
              aIdx._M_array = (iterator)&mapFdLock;
              pJVar4 = jag_FindFirstNonNull(array,aIdx);
              dVar8 = NAN;
              if (pJVar4 != (JSON_Value *)0x0) {
                dVar8 = json_value_get_number(pJVar4);
              }
              mapFdLock._M_device = (mutex_type *)0x5;
              mapFdLock._M_owns = true;
              mapFdLock._9_7_ = 0;
              aIdx_00._M_len = 3;
              aIdx_00._M_array = (iterator)&mapFdLock;
              local_350._head = dVar8;
              dyn.heading = dVar8;
              pJVar4 = jag_FindFirstNonNull(array,aIdx_00);
              if (pJVar4 == (JSON_Value *)0x0) {
                dyn.spd = 0.0;
              }
              else {
                dyn.spd = json_value_get_number(pJVar4);
              }
              mapFdLock._M_device = (mutex_type *)0xf;
              mapFdLock._M_owns = true;
              mapFdLock._9_7_ = 0;
              aIdx_01._M_len = 2;
              aIdx_01._M_array = (iterator)&mapFdLock;
              pJVar4 = jag_FindFirstNonNull(array,aIdx_01);
              if (pJVar4 == (JSON_Value *)0x0) {
                dyn.vsi = 0.0;
              }
              else {
                dyn.vsi = json_value_get_number(pJVar4);
              }
              dyn.ts = local_350._ts;
              dyn.pChannel = (LTChannel *)this;
              std::unique_lock<std::mutex>::unique_lock(&mapFdLock,&mapFdMutex);
              this_00 = std::
                        map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
                        ::operator[](&mapFd,&fdKey);
              std::recursive_mutex::lock(&this_00->dataAccessMutex);
              std::unique_lock<std::mutex>::unlock(&mapFdLock);
              if ((this_00->acKey).key._M_string_length == 0) {
                LTFlightData::SetKey(this_00,&fdKey);
              }
              dVar8 = CoordDistance(&local_350,&posView);
              LTFlightData::UpdateData(this_00,&stat,dVar8,DATREQU_NONE);
              LTFlightData::AddDynData(this_00,&dyn,0,0,&local_350);
              pthread_mutex_unlock((pthread_mutex_t *)&this_00->dataAccessMutex);
              std::unique_lock<std::mutex>::~unique_lock(&mapFdLock);
              std::__cxx11::string::~string((string *)&s);
              LTFlightData::FDStaticData::~FDStaticData(&stat);
            }
            else if ((int)dataRefs.iLogLevel < 1) {
              positionTy::dbgTxt_abi_cxx11_(&stat.reg,&local_350);
              LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                     ,0x32f,"ProcessTrafficBuffer",logDEBUG,"A/c %s reached invalid pos: %s",
                     _Var1._M_p,stat.reg._M_dataplus._M_p);
              std::__cxx11::string::~string((string *)&stat);
            }
          }
          else {
            std::__cxx11::string::string((string *)&local_b8,(string *)&acFilter);
            bVar2 = std::operator!=(&fdKey.key,&local_b8);
            std::__cxx11::string::~string((string *)&local_b8);
            if (!bVar2) goto LAB_0017d0cc;
          }
          std::__cxx11::string::~string((string *)&fdKey.key);
        }
      }
      index = index + 1;
    }
    std::__cxx11::string::~string((string *)&acFilter);
  }
  return pBuf != (JSON_Object *)0x0;
}

Assistant:

bool RealTrafficConnection::ProcessTrafficBuffer (const JSON_Object* pBuf)
{
    // Quick exit if no data
    if (!pBuf) return false;
    
    // any a/c filter defined for debugging purposes?
    const std::string acFilter ( dataRefs.GetDebugAcFilter() );
    
    // Current camera position
    const positionTy posView = dataRefs.GetViewPos();
    
    // The data is delivered in many many values,
    // ie. each plane is just a JSON_Value, its name being the hexid,
    // its value being an array with the details.
    // That means we need to traverse all values, not knowing which are in there.
    // Most are planes, but some are just ordinary values like "status" or "rll"...
    // Really bad data structure design if you'd ask me...
    //   {
    //     "a1bc56": ["a1bc56",34.21124,-118.939533, ...],
    //     "a1ef41": ["a1ef41",34.263657,-118.863373, ...],
    //     ...
    //     "a26738": ["a26738",33.671356,-117.867284, ...],
    //     "full_count": 13501, "source": "MemoryDB", "rrl": 2000, "status": 200, "dataepoch": 1703885732
    //   }
    const size_t numVals = json_object_get_count(pBuf);
    for (size_t i = 0; i < numVals && shallRun(); ++i)
    {
        // Get the array 'behind' the i-th value,
        // will fail if it is no aircraft entry
        const JSON_Value* pVal = json_object_get_value_at(pBuf, i);
        if (!pVal) break;
        const JSON_Array* pJAc = json_value_get_array(pVal);
        if (!pJAc) continue;                  // probably not an aircraft line
        
        // Check for minimum number of fields
        if (json_array_get_count(pJAc) < RT_DRCT_NUM_FIELDS) {
            LOG_MSG(logWARN, "Received too few fields in a/c record %ld", (long)i);
            IncErrCnt();
            continue;
        }
        
        // the key: transponder Icao code
        bool b = jag_l(pJAc, RT_DRCT_ICAO_ID) != 0;   // is an ICAO id?
        LTFlightData::FDKeyTy fdKey (b ? LTFlightData::KEY_ICAO : LTFlightData::KEY_RT,
                                     jag_s(pJAc, RT_DRCT_HexId));
        // not matching a/c filter? -> skip it
        if ((!acFilter.empty() && (fdKey != acFilter)) )
            continue;

        // Check for duplicates with OGN/FLARM, potentially replaces the key type
        if (fdKey.eKeyType == LTFlightData::KEY_ICAO)
            LTFlightData::CheckDupKey(fdKey, LTFlightData::KEY_FLARM);
        else
            // Some codes are otherwise often duplicate with ADSBEx
            LTFlightData::CheckDupKey(fdKey, LTFlightData::KEY_ADSBEX);
        
        // position time
        double posTime = jag_n(pJAc, RT_DRCT_TimeStamp);
        //  (needs adjustment in case we are receiving historical data)
        posTime += tsAdjust;
        
        // position
        positionTy pos (jag_n(pJAc, RT_DRCT_Lat),
                        jag_n(pJAc, RT_DRCT_Lon),
                        NAN,                            // we take care of altitude next
                        posTime);
        if (jag_l(pJAc, RT_DRCT_Gnd) != 0)              // on ground?
            pos.f.onGrnd = GND_ON;
        else {
            pos.f.onGrnd = GND_OFF;
            double d = jag_n_nan(pJAc, RT_DRCT_BaroAlt);    // prefer baro altitude
            if (!std::isnan(d)) {
                if (!std::isnan(rtWx.QNH))
                    d = BaroAltToGeoAlt_ft(d, rtWx.QNH);
                pos.SetAltFt(d);
            }
            else                                        // else try geo altitude
                pos.SetAltFt(jag_n(pJAc, RT_DRCT_GeoAlt));
        }
        // position is rather important, we check for validity
        // (we do allow alt=NAN if on ground)
        if ( !pos.isNormal(true) ) {
            LOG_MSG(logDEBUG,ERR_POS_UNNORMAL,fdKey.c_str(),pos.dbgTxt().c_str());
            continue;
        }
        
        // Static data
        LTFlightData::FDStaticData stat;
        stat.acTypeIcao         = jag_s(pJAc, RT_DRCT_AcType);
        stat.call               = jag_s(pJAc, RT_DRCT_CallSign);
        stat.reg                = jag_s(pJAc, RT_DRCT_Reg);
        stat.setOrigDest(         jag_s(pJAc, RT_DRCT_Origin),
                                  jag_s(pJAc, RT_DRCT_Dest)  );
        stat.flight             = jag_s(pJAc, RT_DRCT_FlightNum);
        
        std::string s           = jag_s(pJAc, RT_DRCT_Category);
        stat.catDescr           = GetADSBEmitterCat(s);
        
        // RealTraffic often sends ASW20 when it should be AS20, a glider
        if (stat.acTypeIcao == "ASW20") stat.acTypeIcao = "AS20";
        
        // Static objects are all equally marked with a/c type TWR
        if ((s == "C3" || s == "C4" || s == "C5") ||
            (stat.reg == STATIC_OBJECT_TYPE && stat.acTypeIcao == STATIC_OBJECT_TYPE))
        {
            stat.reg = stat.acTypeIcao = STATIC_OBJECT_TYPE;
        }

        // Vehicle?
        if (stat.acTypeIcao == "GRND" || stat.acTypeIcao == "GND" ||// some vehicles come with type 'GRND'...
            s == "C1" || s == "C2" ||                               // emergency/surface vehicle?
            (s.empty() && (pos.f.onGrnd == GND_ON) && stat.acTypeIcao.empty() && stat.reg.empty()))
            stat.acTypeIcao = dataRefs.GetDefaultCarIcaoType();

        // Dynamic data
        LTFlightData::FDDynamicData dyn;
        dyn.radar.code          = std::lround(jag_sn(pJAc, RT_DRCT_Squawk));
        dyn.gnd                 = pos.f.onGrnd == GND_ON;
        // Heading: try in this order: True Heading, Track, Magnetic heading
        pVal                    = jag_FindFirstNonNull(pJAc,
                                                       { RT_DRCT_HeadTrue,
                                                         RT_DRCT_Track,
                                                         RT_DRCT_HeadMag });
        pos.heading() = dyn.heading = pVal ? json_value_get_number(pVal) : NAN;
        // Speed: try in this order: ground speed, TAS, IAS, 0.0
        pVal                    = jag_FindFirstNonNull(pJAc,
                                                       { RT_DRCT_GndSpeed,
                                                         RT_DRCT_TAS,
                                                         RT_DRCT_IAS });
        dyn.spd = pVal ? json_value_get_number(pVal) : 0.0;
        // VSI: try in this order barometric and geometric vertical speed
        pVal                    = jag_FindFirstNonNull(pJAc,
                                                       { RT_DRCT_BaroVertRate,
                                                         RT_DRCT_GeoVertRate });
        dyn.vsi = pVal ? json_value_get_number(pVal) : 0.0;
        
        dyn.ts = pos.ts();
        dyn.pChannel = this;
        
        try {
            // from here on access to fdMap guarded by a mutex
            // until FD object is inserted and updated
            std::unique_lock<std::mutex> mapFdLock (mapFdMutex);

            // get the fd object from the map, key is the transpIcao
            // this fetches an existing or, if not existing, creates a new one
            LTFlightData& fd = mapFd[fdKey];
            
            // also get the data access lock once and for all
            // so following fetch/update calls only make quick recursive calls
            std::lock_guard<std::recursive_mutex> fdLock (fd.dataAccessMutex);
            // now that we have the detail lock we can release the global one
            mapFdLock.unlock();

            // completely new? fill key fields
            if ( fd.empty() )
                fd.SetKey(fdKey);
            
            // add the static data
            fd.UpdateData(std::move(stat), pos.dist(posView));

            // add the dynamic data
            fd.AddDynData(dyn, 0, 0, &pos);

        } catch(const std::system_error& e) {
            LOG_MSG(logERR, ERR_LOCK_ERROR, "mapFd", e.what());
            IncErrCnt();
        }
    }
    
    return true;
}